

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

string * __thiscall runtime::Heap::NewString_abi_cxx11_(Heap *this)

{
  string *this_00;
  string *local_28;
  string *ret;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_00,"",(allocator<char> *)((long)&ret + 7));
  local_28 = this_00;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::push_back(&this->createdStrings,&local_28);
  return local_28;
}

Assistant:

std::string* runtime::Heap::NewString() noexcept {
  auto ret = new std::string{""};
  this->createdStrings.push_back(ret);
  return ret;
}